

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

void chan_enable(opl_channel *channel)

{
  opl_channel *channel_local;
  
  if (channel->chip->newm == '\0') {
    eg_keyon(channel->slots[0],'\x01');
    eg_keyon(channel->slots[1],'\x01');
  }
  else if (channel->chtype == '\x01') {
    eg_keyon(channel->slots[0],'\x01');
    eg_keyon(channel->slots[1],'\x01');
    eg_keyon(channel->pair->slots[0],'\x01');
    eg_keyon(channel->pair->slots[1],'\x01');
  }
  else if ((channel->chtype == '\0') || (channel->chtype == '\x03')) {
    eg_keyon(channel->slots[0],'\x01');
    eg_keyon(channel->slots[1],'\x01');
  }
  return;
}

Assistant:

void chan_enable(opl_channel *channel) {
	if (channel->chip->newm) {
		if (channel->chtype == ch_4op) {
			eg_keyon(channel->slots[0], egk_norm);
			eg_keyon(channel->slots[1], egk_norm);
			eg_keyon(channel->pair->slots[0], egk_norm);
			eg_keyon(channel->pair->slots[1], egk_norm);
		}
		else if (channel->chtype == ch_2op || channel->chtype == ch_drum) {
			eg_keyon(channel->slots[0], egk_norm);
			eg_keyon(channel->slots[1], egk_norm);
		}
	}
	else {
		eg_keyon(channel->slots[0], egk_norm);
		eg_keyon(channel->slots[1], egk_norm);
	}
}